

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O2

_Bool square_changeable(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  object *poVar2;
  
  _Var1 = square_ispermanent(c,grid);
  if (_Var1) {
    _Var1 = false;
  }
  else {
    for (poVar2 = square_object(c,grid);
        (_Var1 = poVar2 == (object *)0x0, !_Var1 && (poVar2->artifact == (artifact *)0x0));
        poVar2 = poVar2->next) {
    }
  }
  return _Var1;
}

Assistant:

bool square_changeable(struct chunk *c, struct loc grid)
{
	struct object *obj;

	/* Forbid perma-grids */
	if (square_ispermanent(c, grid))
		return (false);

	/* Check objects */
	for (obj = square_object(c, grid); obj; obj = obj->next)
		/* Forbid artifact grids */
		if (obj->artifact) return (false);

	/* Accept */
	return (true);
}